

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnViewPrivate::initialize(QColumnViewPrivate *this)

{
  long lVar1;
  QColumnView *this_00;
  QAbstractItemDelegate *pQVar2;
  QColumnViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QColumnView *q;
  undefined8 in_stack_ffffffffffffff58;
  TextElideMode mode;
  code *parent;
  QAbstractItemView *in_stack_ffffffffffffff60;
  QColumnViewDelegate *this_01;
  QColumnViewPrivate *receiverPrivate;
  QEasingCurve in_stack_ffffffffffffffc0;
  QByteArray local_38;
  Connection in_stack_fffffffffffffff0;
  
  mode = (TextElideMode)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  receiverPrivate = in_RDI;
  this_00 = q_func(in_RDI);
  QAbstractItemView::setTextElideMode(in_stack_ffffffffffffff60,mode);
  parent = changeCurrentColumn;
  this_01 = (QColumnViewDelegate *)0x0;
  QObjectPrivate::connect<void(QAbstractAnimation::*)(),void(QColumnViewPrivate::*)()>
            ((Object *)in_stack_ffffffffffffffc0.d_ptr,
             (offset_in_QAbstractAnimation_to_subr)in_stack_fffffffffffffff0.d_ptr,receiverPrivate,
             0x861270,(ConnectionType)((ulong)this_00 >> 0x20));
  QMetaObject::Connection::operator=((Connection *)this_01,(Connection *)parent);
  QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
  QPropertyAnimation::setTargetObject((QObject *)&in_RDI->currentAnimation);
  QByteArray::QByteArray(&local_38,"value",-1);
  QPropertyAnimation::setPropertyName((QByteArray *)&in_RDI->currentAnimation);
  QByteArray::~QByteArray((QByteArray *)0x861147);
  QEasingCurve::QEasingCurve((QEasingCurve *)&stack0xffffffffffffffc0,InOutQuad);
  QVariantAnimation::setEasingCurve((QEasingCurve *)&in_RDI->currentAnimation);
  QEasingCurve::~QEasingCurve((QEasingCurve *)&stack0xffffffffffffffc0);
  pQVar2 = ::QPointer::operator_cast_to_QAbstractItemDelegate_
                     ((QPointer<QAbstractItemDelegate> *)0x861190);
  if (pQVar2 != (QAbstractItemDelegate *)0x0) {
    (**(code **)(*(long *)pQVar2 + 0x20))();
  }
  pQVar2 = (QAbstractItemDelegate *)operator_new(0x10);
  QColumnViewDelegate::QColumnViewDelegate(this_01,(QObject *)parent);
  QAbstractItemView::setItemDelegate(&this_00->super_QAbstractItemView,pQVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewPrivate::initialize()
{
    Q_Q(QColumnView);
    q->setTextElideMode(Qt::ElideMiddle);
#if QT_CONFIG(animation)
    animationConnection =
        QObjectPrivate::connect(&currentAnimation, &QPropertyAnimation::finished,
                                this, &QColumnViewPrivate::changeCurrentColumn);
    currentAnimation.setTargetObject(hbar);
    currentAnimation.setPropertyName("value");
    currentAnimation.setEasingCurve(QEasingCurve::InOutQuad);
#endif // animation
    delete itemDelegate;
    q->setItemDelegate(new QColumnViewDelegate(q));
}